

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O0

function_return
function_mock_interface_invoke(function func,function_impl impl,void **args,size_t size)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  function_return pvVar5;
  ulong in_RCX;
  long in_RDX;
  undefined8 in_RDI;
  uchar b;
  type_id id_1;
  void *value_ptr_8;
  char *value_ptr_7;
  double *value_ptr_6;
  float *value_ptr_5;
  long *value_ptr_4;
  int *value_ptr_3;
  short *value_ptr_2;
  char *value_ptr_1;
  uchar *value_ptr;
  type_id id;
  type t;
  size_t args_count;
  type ret_type;
  char *name;
  signature s;
  loader_impl_mock_function mock_function;
  int iVar6;
  ulong local_50;
  
  uVar2 = function_signature(in_RDI);
  uVar3 = function_name(in_RDI);
  lVar4 = signature_get_return(uVar2);
  log_write_impl_va("metacall",0x4a,"function_mock_interface_invoke",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                    ,0,"Invoking mock function %s",uVar3);
  if (in_RCX == 0) {
    log_write_impl_va("metacall",0x98,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Calling mock function without arguments",uVar3);
  }
  else {
    for (local_50 = 0; local_50 < in_RCX; local_50 = local_50 + 1) {
      uVar3 = signature_get_type(uVar2,local_50);
      iVar1 = type_index(uVar3);
      iVar6 = iVar1;
      log_write_impl_va("metacall",0x56,"function_mock_interface_invoke",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,0,"Type %p, %d",uVar3,iVar1);
      if (iVar1 == 0) {
        log_write_impl_va("metacall",0x5c,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Boolean value: %d",**(undefined1 **)(in_RDX + local_50 * 8),iVar6);
      }
      else if (iVar1 == 1) {
        log_write_impl_va("metacall",0x62,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Char value: %c",(int)**(char **)(in_RDX + local_50 * 8),iVar6);
      }
      else if (iVar1 == 2) {
        log_write_impl_va("metacall",0x68,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Short value: %d",(int)**(short **)(in_RDX + local_50 * 8),iVar6);
      }
      else if (iVar1 == 3) {
        log_write_impl_va("metacall",0x6e,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Int value: %d",**(undefined4 **)(in_RDX + local_50 * 8),iVar6);
      }
      else if (iVar1 == 4) {
        log_write_impl_va("metacall",0x74,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Long value: %ld",**(undefined8 **)(in_RDX + local_50 * 8),iVar6);
      }
      else if (iVar1 == 5) {
        log_write_impl_va((double)**(float **)(in_RDX + local_50 * 8),"metacall",0x7a,
                          "function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Float value: %f",uVar3,iVar6);
      }
      else if (iVar1 == 6) {
        log_write_impl_va(**(undefined8 **)(in_RDX + local_50 * 8),"metacall",0x80,
                          "function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Double value: %f",uVar3,iVar6);
      }
      else if (iVar1 == 7) {
        log_write_impl_va("metacall",0x86,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"String value: %s",*(undefined8 *)(in_RDX + local_50 * 8),iVar6);
      }
      else if (iVar1 == 0xb) {
        log_write_impl_va("metacall",0x8c,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,"Pointer value: %p",*(undefined8 *)(in_RDX + local_50 * 8),iVar6);
      }
      else {
        log_write_impl_va("metacall",0x90,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,3,"Unrecognized value: %p",*(undefined8 *)(in_RDX + local_50 * 8),iVar6);
      }
    }
    log_write_impl_va("metacall",0x94,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Calling mock function with arguments (%lu)",in_RCX);
  }
  if (lVar4 != 0) {
    iVar1 = type_index(lVar4);
    iVar6 = iVar1;
    log_write_impl_va("metacall",0x9f,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Return type %p, %d",lVar4,iVar1);
    if (iVar1 == 0) {
      pvVar5 = (function_return)value_create_bool(1);
      return pvVar5;
    }
    if (iVar1 == 1) {
      pvVar5 = (function_return)value_create_char(0x41);
      return pvVar5;
    }
    if (iVar1 == 2) {
      pvVar5 = (function_return)value_create_short(0x7c);
      return pvVar5;
    }
    if (iVar1 == 3) {
      pvVar5 = (function_return)value_create_int(0x4d2);
      return pvVar5;
    }
    if (iVar1 == 4) {
      pvVar5 = (function_return)value_create_long(90000);
      return pvVar5;
    }
    if (iVar1 == 5) {
      pvVar5 = (function_return)value_create_float(0x3e4ccccd);
      return pvVar5;
    }
    if (iVar1 == 6) {
      pvVar5 = (function_return)value_create_double(0x400921ff2e48e8a7);
      return pvVar5;
    }
    if (iVar1 == 7) {
      pvVar5 = (function_return)value_create_string("Hello World",0xb);
      return pvVar5;
    }
    if (iVar1 == 0xb) {
      pvVar5 = (function_return)value_create_ptr(&function_mock_interface_invoke::int_val);
      return pvVar5;
    }
    log_write_impl_va("metacall",0xcd,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,3,"Unrecognized return type",lVar4,iVar6);
  }
  return (function_return)0x0;
}

Assistant:

function_return function_mock_interface_invoke(function func, function_impl impl, function_args args, size_t size)
{
	loader_impl_mock_function mock_function = (loader_impl_mock_function)impl;

	signature s = function_signature(func);

	const char *name = function_name(func);

	type ret_type = signature_get_return(s);

	(void)mock_function;

	log_write("metacall", LOG_LEVEL_DEBUG, "Invoking mock function %s", name);

	if (size > 0)
	{
		size_t args_count;

		for (args_count = 0; args_count < size; ++args_count)
		{
			type t = signature_get_type(s, args_count);

			type_id id = type_index(t);

			log_write("metacall", LOG_LEVEL_DEBUG, "Type %p, %d", (void *)t, id);

			if (id == TYPE_BOOL)
			{
				boolean *value_ptr = (boolean *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Boolean value: %d", *value_ptr);
			}
			else if (id == TYPE_CHAR)
			{
				char *value_ptr = (char *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Char value: %c", *value_ptr);
			}
			else if (id == TYPE_SHORT)
			{
				short *value_ptr = (short *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Short value: %d", *value_ptr);
			}
			else if (id == TYPE_INT)
			{
				int *value_ptr = (int *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Int value: %d", *value_ptr);
			}
			else if (id == TYPE_LONG)
			{
				long *value_ptr = (long *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Long value: %ld", *value_ptr);
			}
			else if (id == TYPE_FLOAT)
			{
				float *value_ptr = (float *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Float value: %f", *value_ptr);
			}
			else if (id == TYPE_DOUBLE)
			{
				double *value_ptr = (double *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Double value: %f", *value_ptr);
			}
			else if (id == TYPE_STRING)
			{
				const char *value_ptr = (const char *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "String value: %s", value_ptr);
			}
			else if (id == TYPE_PTR)
			{
				void *value_ptr = (void *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Pointer value: %p", value_ptr);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Unrecognized value: %p", args[args_count]);
			}
		}

		log_write("metacall", LOG_LEVEL_DEBUG, "Calling mock function with arguments (%lu)", size);
	}
	else
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Calling mock function without arguments");
	}

	if (ret_type != NULL)
	{
		type_id id = type_index(ret_type);

		log_write("metacall", LOG_LEVEL_DEBUG, "Return type %p, %d", (void *)ret_type, id);

		if (id == TYPE_BOOL)
		{
			boolean b = 1;

			return value_create_bool(b);
		}
		else if (id == TYPE_CHAR)
		{
			return value_create_char('A');
		}
		else if (id == TYPE_SHORT)
		{
			return value_create_short(124);
		}
		else if (id == TYPE_INT)
		{
			return value_create_int(1234);
		}
		else if (id == TYPE_LONG)
		{
			return value_create_long(90000L);
		}
		else if (id == TYPE_FLOAT)
		{
			return value_create_float(0.2f);
		}
		else if (id == TYPE_DOUBLE)
		{
			return value_create_double(3.1416);
		}
		else if (id == TYPE_STRING)
		{
			static const char str[] = "Hello World";

			return value_create_string(str, sizeof(str) - 1);
		}
		else if (id == TYPE_PTR)
		{
			static int int_val = 15;

			return value_create_ptr(&int_val);
		}
		else
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Unrecognized return type");
		}
	}

	return NULL;
}